

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

bool compactor_is_file_removed(char *filename)

{
  avl_node *paVar1;
  char *in_RDI;
  openfiles_elem_conflict query;
  avl_node *a;
  char acStackY_558 [16];
  avl_cmp_func *in_stack_fffffffffffffab8;
  avl_node *in_stack_fffffffffffffac0;
  avl_tree *in_stack_fffffffffffffac8;
  
  strcpy(acStackY_558,in_RDI);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  paVar1 = avl_search(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8)
  ;
  pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  return paVar1 == (avl_node *)0x0;
}

Assistant:

bool compactor_is_file_removed(const char *filename)
{
    struct avl_node *a;
    struct openfiles_elem query;

    strcpy(query.filename, filename);
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    mutex_unlock(&cpt_lock);
    if (a) {
        // exist .. old file is not removed yet
        return false;
    }
    return true;
}